

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError WebPMuxGetFrame(WebPMux *mux,uint32_t nth,WebPMuxFrameInfo *frame)

{
  WebPMuxFrameInfo *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  WebPMuxImage *wpi;
  WebPMuxError err;
  WebPMuxFrameInfo *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (in_RDX == (WebPMuxFrameInfo *)0x0)) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    local_4 = MuxImageGetNth((WebPMuxImage **)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd4,(WebPMuxImage **)in_stack_ffffffffffffffc8);
    if (local_4 == WEBP_MUX_OK) {
      if (*(long *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0) == 0) {
        local_4 = MuxGetImageInternal((WebPMuxImage *)
                                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                      in_stack_ffffffffffffffc8);
      }
      else {
        local_4 = MuxGetFrameInternal((WebPMuxImage *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      in_RDX);
      }
    }
  }
  return local_4;
}

Assistant:

WebPMuxError WebPMuxGetFrame(
    const WebPMux* mux, uint32_t nth, WebPMuxFrameInfo* frame) {
  WebPMuxError err;
  WebPMuxImage* wpi;

  if (mux == NULL || frame == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Get the nth WebPMuxImage.
  err = MuxImageGetNth((const WebPMuxImage**)&mux->images, nth, &wpi);
  if (err != WEBP_MUX_OK) return err;

  // Get frame info.
  if (wpi->header == NULL) {
    return MuxGetImageInternal(wpi, frame);
  } else {
    return MuxGetFrameInternal(wpi, frame);
  }
}